

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

int __thiscall MPLSParser::pgIndexToFullIndex(MPLSParser *this,int value)

{
  pointer pMVar1;
  int iVar2;
  long lVar3;
  StreamType *pSVar4;
  
  pMVar1 = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar4 = &(pMVar1->super_M2TSStreamInfo).stream_coding_type;
  iVar2 = 0;
  lVar3 = 0;
  do {
    if (((long)(this->m_streamInfo).
               super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pMVar1) / 0x70 == lVar3) {
      return -1;
    }
    if (*pSVar4 == SUB_PGS) {
      if (iVar2 == value) {
        return (int)lVar3;
      }
      iVar2 = iVar2 + 1;
    }
    lVar3 = lVar3 + 1;
    pSVar4 = pSVar4 + 0x1c;
  } while( true );
}

Assistant:

int MPLSParser::pgIndexToFullIndex(const int value) const
{
    int cnt = 0;
    for (size_t i = 0; i < m_streamInfo.size(); ++i)
    {
        if (m_streamInfo[i].stream_coding_type == StreamType::SUB_PGS)
        {
            if (cnt++ == value)
                return static_cast<int>(i);
        }
    }
    return -1;
}